

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall wasm::Printer::run(Printer *this,Module *module)

{
  PassOptions *pPVar1;
  undefined1 local_1a0 [8];
  PrintSExpression print;
  Module *module_local;
  Printer *this_local;
  
  print.typePrinter.fallbackNames._M_h._M_single_bucket = (__node_base_ptr)module;
  PrintSExpression::PrintSExpression((PrintSExpression *)local_1a0,this->o);
  pPVar1 = Pass::getPassOptions(&this->super_Pass);
  PrintSExpression::setDebugInfo((PrintSExpression *)local_1a0,(bool)(pPVar1->debugInfo & 1));
  PrintSExpression::visitModule
            ((PrintSExpression *)local_1a0,
             (Module *)print.typePrinter.fallbackNames._M_h._M_single_bucket);
  PrintSExpression::~PrintSExpression((PrintSExpression *)local_1a0);
  return;
}

Assistant:

void run(Module* module) override {
    PrintSExpression print(o);
    print.setDebugInfo(getPassOptions().debugInfo);
    print.visitModule(module);
  }